

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86LEA(uchar *stream,x86Reg dst,uint labelID,int shift)

{
  UnsatisfiedJump *pUVar1;
  ulong uVar2;
  ulong uVar3;
  UnsatisfiedJump local_20;
  
  local_20.labelID = labelID & 0x7fffffff;
  local_20.jmpPos = stream + 1;
  *stream = 0x8d;
  local_20.isNear = true;
  uVar3 = (ulong)pendingJumps.count;
  if (pendingJumps.count == pendingJumps.max) {
    FastVector<UnsatisfiedJump,_false,_false>::grow_and_add
              (&pendingJumps,pendingJumps.count,&local_20);
  }
  else {
    pendingJumps.count = pendingJumps.count + 1;
    uVar2 = CONCAT44(local_20._4_4_,labelID) & 0xffffffff7fffffff;
    pUVar1 = pendingJumps.data + uVar3;
    pUVar1->labelID = (int)uVar2;
    pUVar1->isNear = (bool)(char)(uVar2 >> 0x20);
    *(int3 *)&pUVar1->field_0x5 = (int3)(uVar2 >> 0x28);
    pUVar1->jmpPos = local_20.jmpPos;
  }
  if ((byte)regCode[dst] < 0x10) {
    stream[1] = (regCode[dst] & 7U) << 3 | regCode[7];
    stream[2] = 0xcd;
    stream[3] = 0xcd;
    stream[4] = 0xcd;
    stream[5] = 0xcd;
    return 6;
  }
  __assert_fail("spareField < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x3c,
                "unsigned int encodeAddress(unsigned char *, x86Reg, int, x86Reg, int, unsigned int)"
               );
}

Assistant:

int x86LEA(unsigned char *stream, x86Reg dst, unsigned int labelID, int shift)
{
	unsigned char *start = stream;

	labelID &= 0x7FFFFFFF;
	(void)shift;

	*stream++ = 0x8d;
	
	pendingJumps.push_back(UnsatisfiedJump(labelID, true, stream));
	stream += encodeAddress(stream, rNONE, 1, rNONE, 0xcdcdcdcd, regCode[dst]);

	return int(stream - start);
}